

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecore.cpp
# Opt level: O0

void __thiscall CCharacterCore::Tick(CCharacterCore *this,bool UseInput)

{
  long lVar1;
  vector2_base<float> line_point0;
  bool bVar2;
  uint uVar3;
  vec2 Pos0;
  vec2 Pos1;
  byte in_SIL;
  vector2_base<float> in_RDI;
  long in_FS_OFFSET;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  vector2_base<float> vVar8;
  float Accel_1;
  float Velocity;
  float a;
  float Distance_1;
  CCharacterCore *pCharCore_2;
  int i_1;
  CCharacterCore *pCharCore_1;
  CCharacterCore *pCharCore;
  int i;
  float Distance;
  int Hit;
  bool GoingToRetract;
  bool GoingToHitGround;
  float Friction;
  float Accel;
  float MaxSpeed;
  bool Grounded;
  vec2 Dir;
  vec2 NewVel;
  vec2 HookVel;
  vec2 ClosestPoint;
  vec2 NewPos;
  vec2 TargetDirection;
  vector2_base<float> *in_stack_fffffffffffffe18;
  float in_stack_fffffffffffffe20;
  float in_stack_fffffffffffffe24;
  vector2_base<float> *in_stack_fffffffffffffe28;
  CCollision *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  CCollision *in_stack_fffffffffffffe40;
  CTuneParam *local_198;
  undefined7 in_stack_fffffffffffffe90;
  bool bVar9;
  undefined1 uVar10;
  anon_union_4_2_94730284_for_vector2_base<float>_1 in_stack_fffffffffffffe98;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 in_stack_fffffffffffffe9c;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_14c;
  int local_138;
  float local_134;
  vector2_base<float> local_f8;
  vector2_base<float> local_f0;
  vector2_base<float> local_e8;
  vector2_base<float> local_e0;
  vector2_base<float> local_d8;
  vector2_base<float> local_d0;
  vector2_base<float> local_c8;
  vector2_base<float> local_c0;
  vector2_base<float> local_b8;
  vector2_base<float> local_b0;
  vector2_base<float> local_a8;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_a0;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_9c;
  undefined8 local_98;
  vector2_base<float> local_90;
  undefined8 local_88;
  vector2_base<float> local_80;
  vector2_base<float> local_78;
  vec2 local_70;
  vector2_base<float> local_68;
  vector2_base<float> local_60;
  vector2_base<float> local_58;
  vector2_base<float> local_50;
  vector2_base<float> local_48;
  vector2_base<float> local_40;
  vector2_base<float> local_38;
  vector2_base<float> local_30;
  vector2_base<float> local_28;
  vector2_base<float> local_20;
  vector2_base<float> local_18;
  vector2_base<float> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ((anon_union_4_2_947302a4_for_vector2_base<float>_3 *)((long)in_RDI + 0x7c))->y = 0.0;
  bVar2 = CCollision::CheckPoint
                    (in_stack_fffffffffffffe30,(float)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                     SUB84(in_stack_fffffffffffffe28,0),(int)in_stack_fffffffffffffe24);
  bVar9 = true;
  if (!bVar2) {
    bVar9 = CCollision::CheckPoint
                      (in_stack_fffffffffffffe30,(float)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                       SUB84(in_stack_fffffffffffffe28,0),(int)in_stack_fffffffffffffe24);
  }
  uVar10 = bVar9;
  vector2_base<float>::vector2_base
            (&local_18,(float)((vec2 *)((long)in_RDI + 0x58))->field_0,
             (float)*(anon_union_4_2_947302a4_for_vector2_base<float>_3 *)((long)in_RDI + 0x5c));
  local_10 = normalize(in_stack_fffffffffffffe18);
  fVar4 = CTuneParam::operator_cast_to_float((CTuneParam *)((long)*(vec2 *)in_RDI + 0x30));
  ((anon_union_4_2_947302a4_for_vector2_base<float>_3 *)((long)in_RDI + 0x1c))->y =
       fVar4 + ((anon_union_4_2_947302a4_for_vector2_base<float>_3 *)((long)in_RDI + 0x1c))->y;
  if (bVar9 == false) {
    Pos0 = (vec2)((long)*(vec2 *)in_RDI + 0x14);
  }
  else {
    Pos0 = *(vec2 *)in_RDI;
  }
  fVar4 = CTuneParam::operator_cast_to_float((CTuneParam *)Pos0);
  if (bVar9 == false) {
    Pos1 = (vec2)((long)*(vec2 *)in_RDI + 0x18);
  }
  else {
    Pos1 = (vec2)((long)*(vec2 *)in_RDI + 4);
  }
  fVar5 = CTuneParam::operator_cast_to_float((CTuneParam *)Pos1);
  if (bVar9 == false) {
    local_198 = (CTuneParam *)((long)*(vec2 *)in_RDI + 0x1c);
  }
  else {
    local_198 = (CTuneParam *)((long)*(vec2 *)in_RDI + 8);
  }
  fVar6 = CTuneParam::operator_cast_to_float(local_198);
  if ((in_SIL & 1) != 0) {
    *(anon_union_4_2_947302a4_for_vector2_base<float>_3 *)((long)in_RDI + 0x48) =
         *(anon_union_4_2_947302a4_for_vector2_base<float>_3 *)((long)in_RDI + 0x54);
    vector2_base<float>::vector2_base
              (&local_20,(float)((vec2 *)((long)in_RDI + 0x58))->field_0,
               (float)*(anon_union_4_2_947302a4_for_vector2_base<float>_3 *)((long)in_RDI + 0x5c));
    fVar7 = angle((vector2_base<float> *)0x25aec4);
    *(int *)((long)in_RDI + 0x4c) = (int)(fVar7 * 256.0);
    if (((vec2 *)((long)in_RDI + 0x60))->field_0 ==
        (anon_union_4_2_94730284_for_vector2_base<float>_1)0x0) {
      *(float *)((long)in_RDI + 0x44) =
           *(anon_union_4_2_947302a4_for_vector2_base<float>_3 *)((long)in_RDI + 0x44) & 0xfffffffe;
    }
    else if (((uint)*(anon_union_4_2_947302a4_for_vector2_base<float>_3 *)((long)in_RDI + 0x44) & 1)
             == 0) {
      if (bVar9 == false) {
        if (((uint)*(anon_union_4_2_947302a4_for_vector2_base<float>_3 *)((long)in_RDI + 0x44) & 2)
            == 0) {
          *(float *)((long)in_RDI + 0x7c) =
               *(anon_union_4_2_947302a4_for_vector2_base<float>_3 *)((long)in_RDI + 0x7c) | 2;
          fVar7 = CTuneParam::operator_cast_to_float((CTuneParam *)((long)*(vec2 *)in_RDI + 0x10));
          *(float *)((long)in_RDI + 0x1c) = fVar7 ^ 0x80000000;
          *(float *)((long)in_RDI + 0x44) =
               *(anon_union_4_2_947302a4_for_vector2_base<float>_3 *)((long)in_RDI + 0x44) | 3;
        }
      }
      else {
        *(float *)((long)in_RDI + 0x7c) =
             *(anon_union_4_2_947302a4_for_vector2_base<float>_3 *)((long)in_RDI + 0x7c) | 1;
        fVar7 = CTuneParam::operator_cast_to_float((CTuneParam *)((long)*(vec2 *)in_RDI + 0xc));
        *(float *)((long)in_RDI + 0x1c) = fVar7 ^ 0x80000000;
        *(float *)((long)in_RDI + 0x44) =
             *(anon_union_4_2_947302a4_for_vector2_base<float>_3 *)((long)in_RDI + 0x44) | 1;
      }
    }
    if (((vec2 *)((long)in_RDI + 0x68))->field_0 ==
        (anon_union_4_2_94730284_for_vector2_base<float>_1)0x0) {
      (((vec2 *)((long)in_RDI + 0x40))->field_0).x = -NAN;
      ((anon_union_4_2_947302a4_for_vector2_base<float>_3 *)((long)in_RDI + 0x3c))->y = 0.0;
      *(vec2 *)((long)in_RDI + 0x28) = *(vec2 *)((long)in_RDI + 0x10);
    }
    else if (*(anon_union_4_2_947302a4_for_vector2_base<float>_3 *)((long)in_RDI + 0x3c) ==
             (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x0) {
      ((anon_union_4_2_947302a4_for_vector2_base<float>_3 *)((long)in_RDI + 0x3c))->y = 5.60519e-45;
      local_38 = vector2_base<float>::operator*
                           ((vector2_base<float> *)in_stack_fffffffffffffe30,
                            (float)((ulong)in_stack_fffffffffffffe28 >> 0x20));
      local_30 = vector2_base<float>::operator*
                           ((vector2_base<float> *)in_stack_fffffffffffffe30,
                            (float)((ulong)in_stack_fffffffffffffe28 >> 0x20));
      local_28 = vector2_base<float>::operator+
                           ((vector2_base<float> *)in_stack_fffffffffffffe30,
                            in_stack_fffffffffffffe28);
      *(vector2_base<float> *)((long)in_RDI + 0x28) = local_28;
      *(vector2_base<float> *)((long)in_RDI + 0x30) = local_10;
      (((vec2 *)((long)in_RDI + 0x40))->field_0).x = -NAN;
      (((vec2 *)((long)in_RDI + 0x38))->field_0).x = 0.0;
    }
  }
  if ((int)((vec2 *)((long)in_RDI + 0x48))->field_0 < 0) {
    fVar7 = SaturatedAdd<float>(-fVar4,fVar4,(((vec2 *)((long)in_RDI + 0x18))->field_0).x,-fVar5);
    (((vec2 *)((long)in_RDI + 0x18))->field_0).x = fVar7;
  }
  if (0 < (int)((vec2 *)((long)in_RDI + 0x48))->field_0) {
    fVar4 = SaturatedAdd<float>(-fVar4,fVar4,(((vec2 *)((long)in_RDI + 0x18))->field_0).x,fVar5);
    (((vec2 *)((long)in_RDI + 0x18))->field_0).x = fVar4;
  }
  if (((vec2 *)((long)in_RDI + 0x48))->field_0 ==
      (anon_union_4_2_94730284_for_vector2_base<float>_1)0x0) {
    (((vec2 *)((long)in_RDI + 0x18))->field_0).x =
         fVar6 * (((vec2 *)((long)in_RDI + 0x18))->field_0).x;
  }
  if (bVar9 != false) {
    *(float *)((long)in_RDI + 0x44) =
         *(anon_union_4_2_947302a4_for_vector2_base<float>_3 *)((long)in_RDI + 0x44) & 0xfffffffd;
  }
  if (*(anon_union_4_2_947302a4_for_vector2_base<float>_3 *)((long)in_RDI + 0x3c) ==
      (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x0) {
    (((vec2 *)((long)in_RDI + 0x40))->field_0).x = -NAN;
    ((anon_union_4_2_947302a4_for_vector2_base<float>_3 *)((long)in_RDI + 0x3c))->y = 0.0;
    *(vec2 *)((long)in_RDI + 0x28) = *(vec2 *)((long)in_RDI + 0x10);
  }
  else if (((int)*(anon_union_4_2_947302a4_for_vector2_base<float>_3 *)((long)in_RDI + 0x3c) < 1) ||
          (2 < (int)*(anon_union_4_2_947302a4_for_vector2_base<float>_3 *)((long)in_RDI + 0x3c))) {
    if (*(anon_union_4_2_947302a4_for_vector2_base<float>_3 *)((long)in_RDI + 0x3c) ==
        (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x3) {
      ((anon_union_4_2_947302a4_for_vector2_base<float>_3 *)((long)in_RDI + 0x3c))->y = -NAN;
    }
    else if (*(anon_union_4_2_947302a4_for_vector2_base<float>_3 *)((long)in_RDI + 0x3c) ==
             (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x4) {
      CTuneParam::operator_cast_to_float((CTuneParam *)((long)*(vec2 *)in_RDI + 0x24));
      local_48 = vector2_base<float>::operator*
                           ((vector2_base<float> *)in_stack_fffffffffffffe30,
                            (float)((ulong)in_stack_fffffffffffffe28 >> 0x20));
      local_40 = vector2_base<float>::operator+
                           ((vector2_base<float> *)in_stack_fffffffffffffe30,
                            in_stack_fffffffffffffe28);
      fVar4 = distance<float>((vector2_base<float> *)
                              CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                              in_stack_fffffffffffffe18);
      fVar5 = CTuneParam::operator_cast_to_float((CTuneParam *)((long)*(vec2 *)in_RDI + 0x20));
      if (fVar5 < fVar4) {
        ((anon_union_4_2_947302a4_for_vector2_base<float>_3 *)((long)in_RDI + 0x3c))->y = 1.4013e-45
        ;
        in_stack_fffffffffffffe40 = (CCollision *)((long)in_RDI + 0x10);
        local_68 = vector2_base<float>::operator-
                             ((vector2_base<float> *)in_stack_fffffffffffffe30,
                              in_stack_fffffffffffffe28);
        local_60 = normalize(in_stack_fffffffffffffe18);
        CTuneParam::operator_cast_to_float((CTuneParam *)((long)*(vec2 *)in_RDI + 0x20));
        local_58 = vector2_base<float>::operator*
                             ((vector2_base<float> *)in_stack_fffffffffffffe30,
                              (float)((ulong)in_stack_fffffffffffffe28 >> 0x20));
        local_50 = vector2_base<float>::operator+
                             ((vector2_base<float> *)in_stack_fffffffffffffe30,
                              in_stack_fffffffffffffe28);
        local_40 = local_50;
      }
      local_70 = *(vec2 *)((long)in_RDI + 0x28);
      local_78 = local_40;
      uVar3 = CCollision::IntersectLine
                        (in_stack_fffffffffffffe40,Pos0,Pos1,
                         (vec2 *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                         (vec2 *)in_stack_fffffffffffffe30);
      if (*(vec2 *)in_RDI != (vec2)0x0) {
        fVar4 = CTuneParam::operator_cast_to_float((CTuneParam *)((long)*(vec2 *)in_RDI + 0x7c));
        if ((fVar4 != 0.0) || (NAN(fVar4))) {
          local_134 = 0.0;
          for (local_138 = 0; local_138 < 0x40; local_138 = local_138 + 1) {
            vVar8 = *(vector2_base<float> *)(*(long *)in_RDI + 0x80 + (long)local_138 * 8);
            if ((vVar8 != (vector2_base<float>)0x0) && (vVar8 != in_RDI)) {
              local_88 = *(undefined8 *)((long)in_RDI + 0x28);
              local_90 = local_40;
              local_98 = *(undefined8 *)((long)vVar8 + 0x10);
              line_point0.field_1 = in_stack_fffffffffffffe9c;
              line_point0.field_0 = in_stack_fffffffffffffe98;
              vVar8.field_1._3_1_ = uVar10;
              vVar8._0_7_ = in_stack_fffffffffffffe90;
              local_80 = closest_point_on_line<float>(line_point0,vVar8,in_RDI);
              fVar4 = distance<float>((vector2_base<float> *)
                                      CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                                      in_stack_fffffffffffffe18);
              if ((fVar4 < 30.0) &&
                 ((*(int *)((long)in_RDI + 0x40) == -1 ||
                  (fVar4 = distance<float>((vector2_base<float> *)
                                           CONCAT44(in_stack_fffffffffffffe24,
                                                    in_stack_fffffffffffffe20),
                                           in_stack_fffffffffffffe18), fVar4 < local_134)))) {
                *(uint *)((long)in_RDI + 0x7c) = *(uint *)((long)in_RDI + 0x7c) | 4;
                *(undefined4 *)((long)in_RDI + 0x3c) = 5;
                *(int *)((long)in_RDI + 0x40) = local_138;
                local_134 = distance<float>((vector2_base<float> *)
                                            CONCAT44(in_stack_fffffffffffffe24,
                                                     in_stack_fffffffffffffe20),
                                            in_stack_fffffffffffffe18);
              }
            }
          }
        }
      }
      if (*(anon_union_4_2_947302a4_for_vector2_base<float>_3 *)((long)in_RDI + 0x3c) ==
          (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x4) {
        if (uVar3 != 0 && (uVar3 & 4) == 0) {
          *(float *)((long)in_RDI + 0x7c) =
               *(anon_union_4_2_947302a4_for_vector2_base<float>_3 *)((long)in_RDI + 0x7c) | 8;
          ((anon_union_4_2_947302a4_for_vector2_base<float>_3 *)((long)in_RDI + 0x3c))->y =
               7.00649e-45;
        }
        else if (uVar3 != 0 && (uVar3 & 4) != 0) {
          *(float *)((long)in_RDI + 0x7c) =
               *(anon_union_4_2_947302a4_for_vector2_base<float>_3 *)((long)in_RDI + 0x7c) | 0x10;
          ((anon_union_4_2_947302a4_for_vector2_base<float>_3 *)((long)in_RDI + 0x3c))->y =
               1.4013e-45;
        }
        *(vector2_base<float> *)((long)in_RDI + 0x28) = local_40;
      }
    }
  }
  else {
    *(float *)((long)in_RDI + 0x3c) =
         *(anon_union_4_2_947302a4_for_vector2_base<float>_3 *)((long)in_RDI + 0x3c) + 1;
  }
  if (*(anon_union_4_2_947302a4_for_vector2_base<float>_3 *)((long)in_RDI + 0x3c) !=
      (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x5) goto LAB_0025b813;
  if (((vec2 *)((long)in_RDI + 0x40))->field_0 !=
      (anon_union_4_2_94730284_for_vector2_base<float>_1)0xffffffff) {
    lVar1 = *(long *)((long)*(vec2 *)in_RDI + 0x80 +
                     (long)(int)((vec2 *)((long)in_RDI + 0x40))->field_0 * 8);
    if (lVar1 == 0) {
      (((vec2 *)((long)in_RDI + 0x40))->field_0).x = -NAN;
      ((anon_union_4_2_947302a4_for_vector2_base<float>_3 *)((long)in_RDI + 0x3c))->y = -NAN;
      *(vec2 *)((long)in_RDI + 0x28) = *(vec2 *)((long)in_RDI + 0x10);
    }
    else {
      *(vec2 *)((long)in_RDI + 0x28) = *(vec2 *)(lVar1 + 0x10);
    }
  }
  if ((((vec2 *)((long)in_RDI + 0x40))->field_0 ==
       (anon_union_4_2_94730284_for_vector2_base<float>_1)0xffffffff) &&
     (fVar4 = distance<float>((vector2_base<float> *)
                              CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                              in_stack_fffffffffffffe18), 46.0 < fVar4)) {
    local_b0 = vector2_base<float>::operator-
                         ((vector2_base<float> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28
                         );
    local_a8 = normalize(in_stack_fffffffffffffe18);
    CTuneParam::operator_cast_to_float((CTuneParam *)((long)*(vec2 *)in_RDI + 0x28));
    _local_a0 = vector2_base<float>::operator*
                          ((vector2_base<float> *)in_stack_fffffffffffffe30,
                           (float)((ulong)in_stack_fffffffffffffe28 >> 0x20));
    if (0.0 < aStack_9c.y) {
      aStack_9c.y = aStack_9c.y * 0.3;
    }
    if (((local_a0.x < 0.0) && ((int)((vec2 *)((long)in_RDI + 0x48))->field_0 < 0)) ||
       ((0.0 < local_a0.x && (0 < (int)((vec2 *)((long)in_RDI + 0x48))->field_0)))) {
      fVar4 = local_a0.x * 0.95;
    }
    else {
      fVar4 = local_a0.x * 0.75;
    }
    _local_a0 = (vector2_base<float>)CONCAT44(aStack_9c,fVar4);
    local_b8 = vector2_base<float>::operator+
                         ((vector2_base<float> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28
                         );
    fVar4 = length((vector2_base<float> *)0x25b75f);
    fVar5 = CTuneParam::operator_cast_to_float((CTuneParam *)((long)*(vec2 *)in_RDI + 0x2c));
    if (fVar5 <= fVar4) {
      fVar4 = length((vector2_base<float> *)0x25b78e);
      fVar5 = length((vector2_base<float> *)0x25b7a2);
      if (fVar5 <= fVar4) goto LAB_0025b7c0;
    }
    *(vector2_base<float> *)((long)in_RDI + 0x18) = local_b8;
  }
LAB_0025b7c0:
  ((vec2 *)((long)in_RDI + 0x38))->field_0 =
       (anon_union_4_2_94730284_for_vector2_base<float>_1)
       (((vec2 *)((long)in_RDI + 0x38))->field_0 + 1);
  if ((((vec2 *)((long)in_RDI + 0x40))->field_0 !=
       (anon_union_4_2_94730284_for_vector2_base<float>_1)0xffffffff) &&
     ((0x3c < (int)((vec2 *)((long)in_RDI + 0x38))->field_0 ||
      (*(long *)((long)*(vec2 *)in_RDI + 0x80 +
                (long)(int)((vec2 *)((long)in_RDI + 0x40))->field_0 * 8) == 0)))) {
    (((vec2 *)((long)in_RDI + 0x40))->field_0).x = -NAN;
    ((anon_union_4_2_947302a4_for_vector2_base<float>_3 *)((long)in_RDI + 0x3c))->y = -NAN;
    *(vec2 *)((long)in_RDI + 0x28) = *(vec2 *)((long)in_RDI + 0x10);
  }
LAB_0025b813:
  if (*(vec2 *)in_RDI != (vec2)0x0) {
    for (local_14c.x = 0.0; (int)local_14c < 0x40; local_14c.x = local_14c.x + 1) {
      vVar8 = *(vector2_base<float> *)((long)*(vec2 *)in_RDI + 0x80 + (long)(int)local_14c * 8);
      if ((vVar8 != (vector2_base<float>)0x0) && (vVar8 != in_RDI)) {
        in_stack_fffffffffffffe30 = (CCollision *)((long)in_RDI + 0x10);
        fVar4 = distance<float>((vector2_base<float> *)
                                CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                                in_stack_fffffffffffffe18);
        local_c8 = vector2_base<float>::operator-
                             ((vector2_base<float> *)in_stack_fffffffffffffe30,
                              in_stack_fffffffffffffe28);
        local_c0 = normalize(in_stack_fffffffffffffe18);
        fVar5 = CTuneParam::operator_cast_to_float((CTuneParam *)((long)*(vec2 *)in_RDI + 0x78));
        if (((fVar5 != 0.0) || (NAN(fVar5))) && ((fVar4 < 35.0 && (0.0 < fVar4)))) {
          fVar5 = length((vector2_base<float> *)0x25b960);
          if (0.0001 < fVar5) {
            local_d0 = normalize(in_stack_fffffffffffffe18);
            dot<float>(&local_d0,&local_c0);
          }
          local_e0 = vector2_base<float>::operator*
                               ((vector2_base<float> *)in_stack_fffffffffffffe30,
                                (float)((ulong)in_stack_fffffffffffffe28 >> 0x20));
          local_d8 = vector2_base<float>::operator*
                               ((vector2_base<float> *)in_stack_fffffffffffffe30,
                                (float)((ulong)in_stack_fffffffffffffe28 >> 0x20));
          vector2_base<float>::operator+=((vector2_base<float> *)((long)in_RDI + 0x18),&local_d8);
          vector2_base<float>::operator*=((vector2_base<float> *)((long)in_RDI + 0x18),0.85);
        }
        if (((vec2 *)((long)in_RDI + 0x40))->field_0 == local_14c) {
          fVar5 = CTuneParam::operator_cast_to_float((CTuneParam *)((long)*(vec2 *)in_RDI + 0x7c));
          if (((fVar5 != 0.0) || (NAN(fVar5))) && (42.0 < fVar4)) {
            in_stack_fffffffffffffe24 =
                 CTuneParam::operator_cast_to_float((CTuneParam *)((long)*(vec2 *)in_RDI + 0x28));
            CTuneParam::operator_cast_to_float((CTuneParam *)((long)*(vec2 *)in_RDI + 0x20));
            in_stack_fffffffffffffe28 = &local_c0;
            local_f0 = vector2_base<float>::operator*
                                 ((vector2_base<float> *)in_stack_fffffffffffffe30,
                                  (float)((ulong)in_stack_fffffffffffffe28 >> 0x20));
            local_e8 = vector2_base<float>::operator*
                                 ((vector2_base<float> *)in_stack_fffffffffffffe30,
                                  (float)((ulong)in_stack_fffffffffffffe28 >> 0x20));
            vector2_base<float>::operator+=((vector2_base<float> *)((long)vVar8 + 0x20),&local_e8);
            vector2_base<float>::operator*
                      ((vector2_base<float> *)in_stack_fffffffffffffe30,
                       (float)((ulong)in_stack_fffffffffffffe28 >> 0x20));
            local_f8 = vector2_base<float>::operator*
                                 ((vector2_base<float> *)in_stack_fffffffffffffe30,
                                  (float)((ulong)in_stack_fffffffffffffe28 >> 0x20));
            vector2_base<float>::operator-=((vector2_base<float> *)((long)in_RDI + 0x20),&local_f8);
            in_stack_fffffffffffffe20 = fVar4;
          }
        }
      }
    }
  }
  fVar5 = (float)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  fVar4 = length((vector2_base<float> *)0x25bbbf);
  if (6000.0 < fVar4) {
    normalize(in_stack_fffffffffffffe18);
    vVar8 = vector2_base<float>::operator*((vector2_base<float> *)in_stack_fffffffffffffe30,fVar5);
    *(vector2_base<float> *)((long)in_RDI + 0x18) = vVar8;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CCharacterCore::Tick(bool UseInput)
{
	m_TriggeredEvents = 0;

	// get ground state
	const bool Grounded =
		m_pCollision->CheckPoint(m_Pos.x+PHYS_SIZE/2, m_Pos.y+PHYS_SIZE/2+5)
		|| m_pCollision->CheckPoint(m_Pos.x-PHYS_SIZE/2, m_Pos.y+PHYS_SIZE/2+5);

	vec2 TargetDirection = normalize(vec2(m_Input.m_TargetX, m_Input.m_TargetY));

	m_Vel.y += m_pWorld->m_Tuning.m_Gravity;

	float MaxSpeed = Grounded ? m_pWorld->m_Tuning.m_GroundControlSpeed : m_pWorld->m_Tuning.m_AirControlSpeed;
	float Accel = Grounded ? m_pWorld->m_Tuning.m_GroundControlAccel : m_pWorld->m_Tuning.m_AirControlAccel;
	float Friction = Grounded ? m_pWorld->m_Tuning.m_GroundFriction : m_pWorld->m_Tuning.m_AirFriction;

	// handle input
	if(UseInput)
	{
		m_Direction = m_Input.m_Direction;
		m_Angle = (int)(angle(vec2(m_Input.m_TargetX, m_Input.m_TargetY))*256.0f);

		// handle jump
		if(m_Input.m_Jump)
		{
			if(!(m_Jumped&1))
			{
				if(Grounded)
				{
					m_TriggeredEvents |= COREEVENTFLAG_GROUND_JUMP;
					m_Vel.y = -m_pWorld->m_Tuning.m_GroundJumpImpulse;
					m_Jumped |= 1;
				}
				else if(!(m_Jumped&2))
				{
					m_TriggeredEvents |= COREEVENTFLAG_AIR_JUMP;
					m_Vel.y = -m_pWorld->m_Tuning.m_AirJumpImpulse;
					m_Jumped |= 3;
				}
			}
		}
		else
			m_Jumped &= ~1;

		// handle hook
		if(m_Input.m_Hook)
		{
			if(m_HookState == HOOK_IDLE)
			{
				m_HookState = HOOK_FLYING;
				m_HookPos = m_Pos+TargetDirection*PHYS_SIZE*1.5f;
				m_HookDir = TargetDirection;
				m_HookedPlayer = -1;
				m_HookTick = 0;
				//m_TriggeredEvents |= COREEVENTFLAG_HOOK_LAUNCH;
			}
		}
		else
		{
			m_HookedPlayer = -1;
			m_HookState = HOOK_IDLE;
			m_HookPos = m_Pos;
		}
	}

	// add the speed modification according to players wanted direction
	if(m_Direction < 0)
		m_Vel.x = SaturatedAdd(-MaxSpeed, MaxSpeed, m_Vel.x, -Accel);
	if(m_Direction > 0)
		m_Vel.x = SaturatedAdd(-MaxSpeed, MaxSpeed, m_Vel.x, Accel);
	if(m_Direction == 0)
		m_Vel.x *= Friction;

	// handle jumping
	// 1 bit = to keep track if a jump has been made on this input
	// 2 bit = to keep track if a air-jump has been made
	if(Grounded)
		m_Jumped &= ~2;

	// do hook
	if(m_HookState == HOOK_IDLE)
	{
		m_HookedPlayer = -1;
		m_HookState = HOOK_IDLE;
		m_HookPos = m_Pos;
	}
	else if(m_HookState >= HOOK_RETRACT_START && m_HookState < HOOK_RETRACT_END)
	{
		m_HookState++;
	}
	else if(m_HookState == HOOK_RETRACT_END)
	{
		m_HookState = HOOK_RETRACTED;
		//m_TriggeredEvents |= COREEVENTFLAG_HOOK_RETRACT;
	}
	else if(m_HookState == HOOK_FLYING)
	{
		vec2 NewPos = m_HookPos+m_HookDir*m_pWorld->m_Tuning.m_HookFireSpeed;
		if(distance(m_Pos, NewPos) > m_pWorld->m_Tuning.m_HookLength)
		{
			m_HookState = HOOK_RETRACT_START;
			NewPos = m_Pos + normalize(NewPos-m_Pos) * m_pWorld->m_Tuning.m_HookLength;
		}

		// make sure that the hook doesn't go though the ground
		bool GoingToHitGround = false;
		bool GoingToRetract = false;
		int Hit = m_pCollision->IntersectLine(m_HookPos, NewPos, &NewPos, 0);
		if(Hit)
		{
			if(Hit&CCollision::COLFLAG_NOHOOK)
				GoingToRetract = true;
			else
				GoingToHitGround = true;
		}

		// Check against other players first
		if(m_pWorld && m_pWorld->m_Tuning.m_PlayerHooking)
		{
			float Distance = 0.0f;
			for(int i = 0; i < MAX_CLIENTS; i++)
			{
				CCharacterCore *pCharCore = m_pWorld->m_apCharacters[i];
				if(!pCharCore || pCharCore == this)
					continue;

				vec2 ClosestPoint = closest_point_on_line(m_HookPos, NewPos, pCharCore->m_Pos);
				if(distance(pCharCore->m_Pos, ClosestPoint) < PHYS_SIZE+2.0f)
				{
					if(m_HookedPlayer == -1 || distance(m_HookPos, pCharCore->m_Pos) < Distance)
					{
						m_TriggeredEvents |= COREEVENTFLAG_HOOK_ATTACH_PLAYER;
						m_HookState = HOOK_GRABBED;
						m_HookedPlayer = i;
						Distance = distance(m_HookPos, pCharCore->m_Pos);
					}
				}
			}
		}

		if(m_HookState == HOOK_FLYING)
		{
			// check against ground
			if(GoingToHitGround)
			{
				m_TriggeredEvents |= COREEVENTFLAG_HOOK_ATTACH_GROUND;
				m_HookState = HOOK_GRABBED;
			}
			else if(GoingToRetract)
			{
				m_TriggeredEvents |= COREEVENTFLAG_HOOK_HIT_NOHOOK;
				m_HookState = HOOK_RETRACT_START;
			}

			m_HookPos = NewPos;
		}
	}

	if(m_HookState == HOOK_GRABBED)
	{
		if(m_HookedPlayer != -1)
		{
			CCharacterCore *pCharCore = m_pWorld->m_apCharacters[m_HookedPlayer];
			if(pCharCore)
				m_HookPos = pCharCore->m_Pos;
			else
			{
				// release hook
				m_HookedPlayer = -1;
				m_HookState = HOOK_RETRACTED;
				m_HookPos = m_Pos;
			}

			// keep players hooked for a max of 1.5sec
			//if(Server()->Tick() > hook_tick+(Server()->TickSpeed()*3)/2)
				//release_hooked();
		}

		// don't do this hook rutine when we are hook to a player
		if(m_HookedPlayer == -1 && distance(m_HookPos, m_Pos) > 46.0f)
		{
			vec2 HookVel = normalize(m_HookPos-m_Pos)*m_pWorld->m_Tuning.m_HookDragAccel;
			// the hook as more power to drag you up then down.
			// this makes it easier to get on top of an platform
			if(HookVel.y > 0)
				HookVel.y *= 0.3f;

			// the hook will boost it's power if the player wants to move
			// in that direction. otherwise it will dampen everything abit
			if((HookVel.x < 0 && m_Direction < 0) || (HookVel.x > 0 && m_Direction > 0))
				HookVel.x *= 0.95f;
			else
				HookVel.x *= 0.75f;

			vec2 NewVel = m_Vel+HookVel;

			// check if we are under the legal limit for the hook
			if(length(NewVel) < m_pWorld->m_Tuning.m_HookDragSpeed || length(NewVel) < length(m_Vel))
				m_Vel = NewVel; // no problem. apply

		}

		// release hook (max hook time is 1.25
		m_HookTick++;
		if(m_HookedPlayer != -1 && (m_HookTick > SERVER_TICK_SPEED+SERVER_TICK_SPEED/5 || !m_pWorld->m_apCharacters[m_HookedPlayer]))
		{
			m_HookedPlayer = -1;
			m_HookState = HOOK_RETRACTED;
			m_HookPos = m_Pos;
		}
	}

	if(m_pWorld)
	{
		for(int i = 0; i < MAX_CLIENTS; i++)
		{
			CCharacterCore *pCharCore = m_pWorld->m_apCharacters[i];
			if(!pCharCore)
				continue;

			//player *p = (player*)ent;
			if(pCharCore == this) // || !(p->flags&FLAG_ALIVE)
				continue; // make sure that we don't nudge our self

			// handle player <-> player collision
			float Distance = distance(m_Pos, pCharCore->m_Pos);
			vec2 Dir = normalize(m_Pos - pCharCore->m_Pos);
			if(m_pWorld->m_Tuning.m_PlayerCollision && Distance < PHYS_SIZE*1.25f && Distance > 0.0f)
			{
				float a = (PHYS_SIZE*1.45f - Distance);
				float Velocity = 0.5f;

				// make sure that we don't add excess force by checking the
				// direction against the current velocity. if not zero.
				if(length(m_Vel) > 0.0001)
					Velocity = 1-(dot(normalize(m_Vel), Dir)+1)/2;

				m_Vel += Dir*a*(Velocity*0.75f);
				m_Vel *= 0.85f;
			}

			// handle hook influence
			if(m_HookedPlayer == i && m_pWorld->m_Tuning.m_PlayerHooking)
			{
				if(Distance > PHYS_SIZE*1.50f) // TODO: fix tweakable variable
				{
					float Accel = m_pWorld->m_Tuning.m_HookDragAccel * (Distance/m_pWorld->m_Tuning.m_HookLength);

					// add force to the hooked player
					pCharCore->m_HookDragVel += Dir*Accel*1.5f;

					// add a little bit force to the guy who has the grip
					m_HookDragVel -= Dir*Accel*0.25f;
				}
			}
		}
	}

	// clamp the velocity to something sane
	if(length(m_Vel) > 6000)
		m_Vel = normalize(m_Vel) * 6000;
}